

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

bool __thiscall llvm::StringRef::getAsInteger(StringRef *this,uint Radix,APInt *Result)

{
  uint ShiftAmt;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  uint numBits;
  size_t sVar10;
  APInt RadixAP;
  APInt CharAP;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  anon_union_8_2_1313ab2f_for_U local_68;
  uint local_60;
  StringRef local_58;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_58.Data = this->Data;
  local_58.Length = this->Length;
  if (Radix == 0) {
    Radix = GetAutoSenseRadix(&local_58);
  }
  if (0x22 < Radix - 2) {
    __assert_fail("Radix > 1 && Radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringRef.cpp"
                  ,0x204,"bool llvm::StringRef::getAsInteger(unsigned int, APInt &) const");
  }
  pcVar8 = local_58.Data;
  sVar9 = local_58.Length;
  if (local_58.Length == 0) {
    return true;
  }
  while (*pcVar8 == '0') {
    sVar9 = sVar9 - 1;
    pcVar8 = pcVar8 + 1;
    if (sVar9 == 0) {
      local_70 = 0x40;
      local_78.VAL = 0;
      APInt::operator=(Result,(APInt *)&local_78);
      if ((0x40 < local_70) && ((void *)local_78.VAL != (void *)0x0)) {
        operator_delete__(local_78.pVal);
      }
      return false;
    }
  }
  uVar3 = 0;
  do {
    ShiftAmt = uVar3;
    uVar4 = 1 << ((byte)ShiftAmt & 0x1f);
    uVar3 = ShiftAmt + 1;
  } while (uVar4 < Radix);
  uVar6 = ShiftAmt * (int)sVar9;
  uVar3 = Result->BitWidth;
  numBits = uVar3;
  if ((uVar3 <= uVar6) && (numBits = uVar6, uVar3 < uVar6)) {
    APInt::zext((APInt *)&local_78,(uint)Result);
    APInt::operator=(Result,(APInt *)&local_78);
    if ((0x40 < local_70) && ((void *)local_78.VAL != (void *)0x0)) {
      operator_delete__(local_78.pVal);
    }
  }
  local_70 = 1;
  local_78.VAL = 0;
  local_60 = 1;
  local_68.VAL = 0;
  if (uVar4 != Radix) {
    APInt::APInt((APInt *)&local_40,numBits,(ulong)Radix,false);
    APInt::operator=((APInt *)&local_78,(APInt *)&local_40);
    if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    APInt::APInt((APInt *)&local_40,numBits,0,false);
    APInt::operator=((APInt *)&local_68,(APInt *)&local_40);
    if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
  }
  uVar3 = Result->BitWidth;
  if ((ulong)uVar3 < 0x41) {
    (Result->U).VAL = 0;
  }
  else {
    *(Result->U).pVal = 0;
    memset((void *)((Result->U).VAL + 8),0,
           (ulong)((int)((ulong)uVar3 + 0x3f >> 3) - 8U & 0xfffffff8));
  }
  sVar10 = 0;
  do {
    bVar1 = pcVar8[sVar10];
    bVar5 = true;
    if ((char)bVar1 < 0x30) goto LAB_001a0ae7;
    iVar2 = -0x30;
    if (0x39 < bVar1) {
      if (bVar1 < 0x61) {
        iVar2 = -0x37;
        if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_001a0ae7;
      }
      else {
        iVar2 = -0x57;
        if (0x7a < bVar1) goto LAB_001a0ae7;
      }
    }
    uVar3 = iVar2 + (char)bVar1;
    if (Radix <= uVar3) goto LAB_001a0ae7;
    uVar7 = (ulong)uVar3;
    if (uVar4 == Radix) {
      APInt::operator<<=(Result,ShiftAmt);
      if (Result->BitWidth < 0x41) {
        bVar1 = -(char)Result->BitWidth;
        (Result->U).VAL = ((uVar7 | (Result->U).VAL) << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
      }
      else {
        *(Result->U).pVal = *(Result->U).pVal | uVar7;
      }
    }
    else {
      APInt::operator*=(Result,(APInt *)&local_78);
      if ((ulong)local_60 < 0x41) {
        local_68.VAL = (uVar7 << (-(char)local_60 & 0x3fU)) >> (-(char)local_60 & 0x3fU);
      }
      else {
        *local_68.pVal = uVar7;
        memset((ulong *)(local_68.VAL + 8),0,
               (ulong)((int)((ulong)local_60 + 0x3f >> 3) - 8U & 0xfffffff8));
      }
      APInt::operator+=(Result,(APInt *)&local_68);
    }
    sVar10 = sVar10 + 1;
  } while (sVar9 != sVar10);
  bVar5 = false;
LAB_001a0ae7:
  if ((0x40 < local_60) && ((ulong *)local_68.VAL != (ulong *)0x0)) {
    operator_delete__(local_68.pVal);
  }
  if (local_70 < 0x41) {
    return bVar5;
  }
  if ((void *)local_78.VAL == (void *)0x0) {
    return bVar5;
  }
  operator_delete__(local_78.pVal);
  return bVar5;
}

Assistant:

bool StringRef::getAsInteger(unsigned Radix, APInt &Result) const {
  StringRef Str = *this;

  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  assert(Radix > 1 && Radix <= 36);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Skip leading zeroes.  This can be a significant improvement if
  // it means we don't need > 64 bits.
  while (!Str.empty() && Str.front() == '0')
    Str = Str.substr(1);

  // If it was nothing but zeroes....
  if (Str.empty()) {
    Result = APInt(64, 0);
    return false;
  }

  // (Over-)estimate the required number of bits.
  unsigned Log2Radix = 0;
  while ((1U << Log2Radix) < Radix) Log2Radix++;
  bool IsPowerOf2Radix = ((1U << Log2Radix) == Radix);

  unsigned BitWidth = Log2Radix * Str.size();
  if (BitWidth < Result.getBitWidth())
    BitWidth = Result.getBitWidth(); // don't shrink the result
  else if (BitWidth > Result.getBitWidth())
    Result = Result.zext(BitWidth);

  APInt RadixAP, CharAP; // unused unless !IsPowerOf2Radix
  if (!IsPowerOf2Radix) {
    // These must have the same bit-width as Result.
    RadixAP = APInt(BitWidth, Radix);
    CharAP = APInt(BitWidth, 0);
  }

  // Parse all the bytes of the string given this radix.
  Result = 0;
  while (!Str.empty()) {
    unsigned CharVal;
    if (Str[0] >= '0' && Str[0] <= '9')
      CharVal = Str[0]-'0';
    else if (Str[0] >= 'a' && Str[0] <= 'z')
      CharVal = Str[0]-'a'+10;
    else if (Str[0] >= 'A' && Str[0] <= 'Z')
      CharVal = Str[0]-'A'+10;
    else
      return true;

    // If the parsed value is larger than the integer radix, the string is
    // invalid.
    if (CharVal >= Radix)
      return true;

    // Add in this character.
    if (IsPowerOf2Radix) {
      Result <<= Log2Radix;
      Result |= CharVal;
    } else {
      Result *= RadixAP;
      CharAP = CharVal;
      Result += CharAP;
    }

    Str = Str.substr(1);
  }

  return false;
}